

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O2

QSize __thiscall QWidgetItem::maximumSize(QWidgetItem *this)

{
  QWidgetPrivate *priv;
  bool bVar1;
  int iVar2;
  QSize QVar3;
  long in_FS_OFFSET;
  QSize local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*(this->super_QLayoutItem)._vptr_QLayoutItem[8])();
  if ((char)iVar2 == '\0') {
    bVar1 = QWidget::testAttribute_helper(this->wid,WA_LayoutUsesWidgetRect);
    if (bVar1) {
      QVar3 = qSmartMaxSize(this,(Alignment)
                                 (this->super_QLayoutItem).align.
                                 super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                                 super_QFlagsStorage<Qt::AlignmentFlag>.i);
    }
    else {
      priv = *(QWidgetPrivate **)&this->wid->field_0x8;
      local_20 = qSmartMaxSize(this,(Alignment)
                                    (this->super_QLayoutItem).align.
                                    super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                                    super_QFlagsStorage<Qt::AlignmentFlag>.i);
      QVar3 = toLayoutItemSize(priv,&local_20);
    }
  }
  else {
    QVar3.wd.m_i = 0;
    QVar3.ht.m_i = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QSize QWidgetItem::maximumSize() const
{
    if (isEmpty()) {
        return QSize(0, 0);
    } else {
        return !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
               ? toLayoutItemSize(wid->d_func(), qSmartMaxSize(this, align))
               : qSmartMaxSize(this, align);
    }
}